

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O0

tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> * __thiscall
polyscope::TransformationGizmo::circleTest
          (TransformationGizmo *this,vec3 raySource,vec3 rayDir,vec3 center,vec3 normal,float radius
          )

{
  vec<3,_float,_(glm::qualifier)0> *in_RDI;
  float fVar1;
  double dVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM4 [16];
  undefined1 in_XMM6 [16];
  vec<3,_float,_(glm::qualifier)0> vVar12;
  float in_stack_00000008;
  vec3 nearestPoint;
  float ringDist;
  float hitRad;
  vec3 hitPoint;
  float tRay;
  float div;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe28;
  vec<3,_float,_(glm::qualifier)0> *__elements_2;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe30;
  float *__elements_1;
  vec<3,_float,_(glm::qualifier)0> *v1;
  vec<3,_float,_(glm::qualifier)0> local_e8;
  vec<3,float,(glm::qualifier)0> local_dc [12];
  float local_d0;
  undefined4 local_cc;
  undefined8 local_c8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_c0;
  undefined8 local_b8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_b0;
  float local_ac;
  vec<3,float,(glm::qualifier)0> local_a8 [12];
  float local_9c;
  undefined4 local_98;
  float local_94;
  undefined8 local_84;
  undefined8 local_74;
  undefined8 local_68;
  undefined8 local_58 [2];
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_28 = vmovlpd_avx(in_ZMM0._0_16_);
  local_48 = vmovlpd_avx(in_ZMM2._0_16_);
  local_68 = vmovlpd_avx(in_XMM4);
  local_84 = vmovlpd_avx(in_XMM6);
  v1 = in_RDI;
  local_74 = local_84;
  local_58[0] = local_68;
  local_38 = local_48;
  local_18 = local_28;
  local_94 = glm::dot<3,float,(glm::qualifier)0>
                       (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  dVar2 = std::fabs((double)(ulong)(uint)local_94);
  auVar11 = ZEXT856(0);
  if (1e-06 <= SUB84(dVar2,0)) {
    vVar12 = glm::operator-(v1,in_RDI);
    local_c0 = vVar12.field_2;
    auVar3._0_8_ = vVar12._0_8_;
    auVar3._8_56_ = auVar11;
    local_c8 = vmovlpd_avx(auVar3._0_16_);
    local_b8 = local_c8;
    local_b0 = local_c0;
    local_ac = glm::dot<3,float,(glm::qualifier)0>
                         (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_ac = local_ac / local_94;
    if (0.0 <= local_ac) {
      auVar11 = (undefined1  [56])0x0;
      vVar12 = glm::operator*(SUB84(in_RDI,0),in_stack_fffffffffffffe30);
      auVar4._0_8_ = vVar12._0_8_;
      auVar4._8_56_ = auVar11;
      vmovlpd_avx(auVar4._0_16_);
      vVar12 = glm::operator+(v1,in_RDI);
      local_e8.field_2 = vVar12.field_2;
      auVar5._0_8_ = vVar12._0_8_;
      auVar5._8_56_ = auVar11;
      local_e8._0_8_ = vmovlpd_avx(auVar5._0_16_);
      __elements_2 = &local_e8;
      __elements_1 = (float *)local_58;
      vVar12 = glm::operator-(v1,in_RDI);
      auVar6._0_8_ = vVar12._0_8_;
      auVar6._8_56_ = auVar11;
      vmovlpd_avx(auVar6._0_16_);
      fVar1 = glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)0x385c42);
      std::fabs((double)(ulong)(uint)(fVar1 - in_stack_00000008));
      auVar11 = extraout_var;
      vVar12 = glm::operator-(v1,in_RDI);
      auVar7._0_8_ = vVar12._0_8_;
      auVar7._8_56_ = auVar11;
      vmovlpd_avx(auVar7._0_16_);
      auVar11 = (undefined1  [56])0x0;
      vVar12 = glm::operator/(v1,(float)((ulong)in_RDI >> 0x20));
      auVar8._0_8_ = vVar12._0_8_;
      auVar8._8_56_ = auVar11;
      vmovlpd_avx(auVar8._0_16_);
      auVar11 = (undefined1  [56])0x0;
      vVar12 = glm::operator*(v1,(float)((ulong)in_RDI >> 0x20));
      auVar9._0_8_ = vVar12._0_8_;
      auVar9._8_56_ = auVar11;
      vmovlpd_avx(auVar9._0_16_);
      vVar12 = glm::operator+(v1,in_RDI);
      auVar10._0_8_ = vVar12._0_8_;
      auVar10._8_56_ = auVar11;
      vmovlpd_avx(auVar10._0_16_);
      std::tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>::
      tuple<float_&,_float_&,_glm::vec<3,_float,_(glm::qualifier)0>_&,_true,_true>
                ((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)v1,(float *)in_RDI,
                 __elements_1,__elements_2);
    }
    else {
      local_cc = 0xffffffff;
      local_d0 = std::numeric_limits<float>::infinity();
      glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_dc,0.0,0.0,0.0);
      std::tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>::
      tuple<int,_float,_glm::vec<3,_float,_(glm::qualifier)0>,_true,_true>
                ((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)v1,(int *)in_RDI,
                 (float *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
  }
  else {
    local_98 = 0xffffffff;
    local_9c = std::numeric_limits<float>::infinity();
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_a8,0.0,0.0,0.0);
    std::tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>::
    tuple<int,_float,_glm::vec<3,_float,_(glm::qualifier)0>,_true,_true>
              ((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)v1,(int *)in_RDI,
               (float *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  }
  return (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)v1;
}

Assistant:

std::tuple<float, float, glm::vec3> TransformationGizmo::circleTest(glm::vec3 raySource, glm::vec3 rayDir,
                                                                    glm::vec3 center, glm::vec3 normal, float radius) {

  // used for explicit constructors below to make old compilers (gcc-5) happy
  typedef std::tuple<float, float, glm::vec3> ret_t;

  // Intersect the ray with the plane defined by the normal
  float div = glm::dot(normal, rayDir);
  if (std::fabs(div) < 1e-6)
    return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // parallel

  float tRay = glm::dot((center - raySource), normal) / div;
  if (tRay < 0) return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // behind the ray

  glm::vec3 hitPoint = raySource + tRay * rayDir;

  // Find the closest point on the circle
  float hitRad = glm::length(hitPoint - center);
  float ringDist = std::fabs(hitRad - radius);
  glm::vec3 nearestPoint = center + (hitPoint - center) / hitRad * radius;

  return ret_t{tRay, ringDist, nearestPoint};
}